

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void finish_pass1(j_decompress_ptr cinfo)

{
  long lVar1;
  long in_RDI;
  j_decompress_ptr unaff_retaddr;
  my_cquantize_ptr_conflict cquantize;
  
  lVar1 = *(long *)(in_RDI + 0x270);
  *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(lVar1 + 0x20);
  select_colors(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(lVar1 + 0x38) = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}